

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void ecmult_const_mult_xonly(void)

{
  int iVar1;
  secp256k1_scalar q_1;
  int res_1;
  secp256k1_fe r;
  secp256k1_fe d_1;
  secp256k1_fe n_1;
  secp256k1_fe x;
  int res;
  secp256k1_scalar q;
  secp256k1_fe v;
  secp256k1_fe resx;
  secp256k1_fe d;
  secp256k1_fe n;
  secp256k1_gej resj;
  secp256k1_gej basej;
  secp256k1_ge base;
  int i;
  secp256k1_scalar *in_stack_00000568;
  secp256k1_scalar *in_stack_00000570;
  secp256k1_gej *in_stack_00000578;
  secp256k1_gej *in_stack_00000580;
  secp256k1_ge *in_stack_fffffffffffffc78;
  secp256k1_gej *in_stack_fffffffffffffc80;
  secp256k1_fe *in_stack_fffffffffffffc90;
  secp256k1_fe *in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb4;
  secp256k1_fe *in_stack_fffffffffffffcd8;
  secp256k1_fe *in_stack_fffffffffffffce0;
  secp256k1_gej local_318 [2];
  undefined1 local_1d0 [12];
  int in_stack_fffffffffffffe3c;
  secp256k1_scalar *in_stack_fffffffffffffe40;
  secp256k1_fe *in_stack_fffffffffffffe48;
  secp256k1_fe *in_stack_fffffffffffffe50;
  secp256k1_fe *in_stack_fffffffffffffe58;
  undefined1 local_70 [108];
  uint local_4;
  
  local_4 = 0;
  while( true ) {
    if (SBORROW4(local_4,COUNT * 2) == (int)(local_4 + COUNT * -2) < 0) {
      local_4 = 0;
      while( true ) {
        if (SBORROW4(local_4,COUNT * 2) == (int)(local_4 + COUNT * -2) < 0) {
          return;
        }
        testutil_random_scalar_order_test((secp256k1_scalar *)in_stack_fffffffffffffca0);
        do {
          testutil_random_fe_test(in_stack_fffffffffffffc90);
          iVar1 = secp256k1_ge_x_on_curve_var(in_stack_fffffffffffffca0);
        } while (iVar1 != 0);
        if ((local_4 & 1) == 0) {
          memcpy(&local_318[0].y,&local_318[0].z,0x30);
        }
        else {
          testutil_random_fe_non_zero_test((secp256k1_fe *)0x148373);
          secp256k1_fe_mul(&in_stack_fffffffffffffc80->x,&in_stack_fffffffffffffc78->x,
                           (secp256k1_fe *)0x14838d);
        }
        if ((local_4 & 1) == 0) {
          in_stack_fffffffffffffc80 = (secp256k1_gej *)0x0;
        }
        else {
          in_stack_fffffffffffffc80 = local_318;
        }
        iVar1 = secp256k1_ecmult_const_xonly
                          (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                           in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                           in_stack_fffffffffffffe3c);
        if (iVar1 != 0) break;
        local_4 = local_4 + 1;
      }
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x11c6,"test condition failed: res == 0");
      abort();
    }
    testutil_random_ge_test
              ((secp256k1_ge *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
    testutil_random_scalar_order_test((secp256k1_scalar *)in_stack_fffffffffffffca0);
    if ((local_4 & 1) == 0) {
      memcpy(local_1d0,local_70,0x30);
    }
    else {
      testutil_random_fe_non_zero_test((secp256k1_fe *)0x14814f);
      secp256k1_fe_mul(&in_stack_fffffffffffffc80->x,&in_stack_fffffffffffffc78->x,
                       (secp256k1_fe *)0x14816c);
    }
    local_318[0]._148_4_ =
         secp256k1_ecmult_const_xonly
                   (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                    in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
    if (local_318[0]._148_4_ == 0) break;
    secp256k1_gej_set_ge(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
    secp256k1_ecmult(in_stack_00000580,in_stack_00000578,in_stack_00000570,in_stack_00000568);
    secp256k1_fe_sqr(&in_stack_fffffffffffffc80->x,&in_stack_fffffffffffffc78->x);
    secp256k1_fe_mul(&in_stack_fffffffffffffc80->x,&in_stack_fffffffffffffc78->x,
                     (secp256k1_fe *)0x148299);
    iVar1 = fe_equal(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x11b1,"test condition failed: fe_equal(&v, &resj.x)");
      abort();
    }
    local_4 = local_4 + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
          ,0x11aa,"test condition failed: res");
  abort();
}

Assistant:

static void ecmult_const_mult_xonly(void) {
    int i;

    /* Test correspondence between secp256k1_ecmult_const and secp256k1_ecmult_const_xonly. */
    for (i = 0; i < 2*COUNT; ++i) {
        secp256k1_ge base;
        secp256k1_gej basej, resj;
        secp256k1_fe n, d, resx, v;
        secp256k1_scalar q;
        int res;
        /* Random base point. */
        testutil_random_ge_test(&base);
        /* Random scalar to multiply it with. */
        testutil_random_scalar_order_test(&q);
        /* If i is odd, n=d*base.x for random non-zero d */
        if (i & 1) {
            testutil_random_fe_non_zero_test(&d);
            secp256k1_fe_mul(&n, &base.x, &d);
        } else {
            n = base.x;
        }
        /* Perform x-only multiplication. */
        res = secp256k1_ecmult_const_xonly(&resx, &n, (i & 1) ? &d : NULL, &q, i & 2);
        CHECK(res);
        /* Perform normal multiplication. */
        secp256k1_gej_set_ge(&basej, &base);
        secp256k1_ecmult(&resj, &basej, &q, NULL);
        /* Check that resj's X coordinate corresponds with resx. */
        secp256k1_fe_sqr(&v, &resj.z);
        secp256k1_fe_mul(&v, &v, &resx);
        CHECK(fe_equal(&v, &resj.x));
    }

    /* Test that secp256k1_ecmult_const_xonly correctly rejects X coordinates not on curve. */
    for (i = 0; i < 2*COUNT; ++i) {
        secp256k1_fe x, n, d, r;
        int res;
        secp256k1_scalar q;
        testutil_random_scalar_order_test(&q);
        /* Generate random X coordinate not on the curve. */
        do {
            testutil_random_fe_test(&x);
        } while (secp256k1_ge_x_on_curve_var(&x));
        /* If i is odd, n=d*x for random non-zero d. */
        if (i & 1) {
            testutil_random_fe_non_zero_test(&d);
            secp256k1_fe_mul(&n, &x, &d);
        } else {
            n = x;
        }
        res = secp256k1_ecmult_const_xonly(&r, &n, (i & 1) ? &d : NULL, &q, 0);
        CHECK(res == 0);
    }
}